

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O0

NameSet * wasm::BranchUtils::BranchAccumulator::get
                    (NameSet *__return_storage_ptr__,Expression *tree)

{
  undefined1 local_120 [8];
  BranchAccumulator accumulator;
  Expression *tree_local;
  
  accumulator.branches._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)tree;
  BranchAccumulator((BranchAccumulator *)local_120);
  Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  ::walk((Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
          *)local_120,
         (Expression **)&accumulator.branches._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            (__return_storage_ptr__,
             (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
             &accumulator.
              super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
              .
              super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
              .currModule);
  ~BranchAccumulator((BranchAccumulator *)local_120);
  return __return_storage_ptr__;
}

Assistant:

static NameSet get(Expression* tree) {
    BranchAccumulator accumulator;
    accumulator.walk(tree);
    return accumulator.branches;
  }